

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool bitset_inplace_union(bitset_t *b1,bitset_t *b2)

{
  ulong uVar1;
  ulong newarraysize;
  uint64_t *puVar2;
  uint64_t *puVar3;
  _Bool _Var4;
  ulong uVar5;
  _Bool _Var6;
  ulong uVar7;
  
  uVar1 = b1->arraysize;
  newarraysize = b2->arraysize;
  uVar5 = newarraysize;
  if (uVar1 < newarraysize) {
    uVar5 = uVar1;
  }
  if (uVar5 != 0) {
    puVar2 = b2->array;
    puVar3 = b1->array;
    uVar7 = 0;
    do {
      puVar3[uVar7] = puVar3[uVar7] | puVar2[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar5 != uVar7);
  }
  _Var6 = true;
  if (uVar1 <= newarraysize && newarraysize - uVar1 != 0) {
    _Var6 = false;
    _Var4 = bitset_resize(b1,newarraysize,false);
    if (_Var4) {
      memcpy(b1->array + uVar1,b2->array + uVar1,(newarraysize - uVar1) * 8);
      _Var6 = true;
    }
  }
  return _Var6;
}

Assistant:

bool bitset_inplace_union(bitset_t *CROARING_CBITSET_RESTRICT b1,
                          const bitset_t *CROARING_CBITSET_RESTRICT b2) {
    size_t minlength =
        b1->arraysize < b2->arraysize ? b1->arraysize : b2->arraysize;
    for (size_t k = 0; k < minlength; ++k) {
        b1->array[k] |= b2->array[k];
    }
    if (b2->arraysize > b1->arraysize) {
        size_t oldsize = b1->arraysize;
        if (!bitset_resize(b1, b2->arraysize, false)) return false;
        memcpy(b1->array + oldsize, b2->array + oldsize,
               (b2->arraysize - oldsize) * sizeof(uint64_t));
    }
    return true;
}